

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool argparse::Argument::is_integer(string *aValue)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  char *__nptr;
  char *local_20;
  char *tPtr;
  string *aValue_local;
  
  tPtr = (char *)aValue;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (aValue);
  if (bVar1) {
LAB_00110f4d:
    aValue_local._7_1_ = false;
  }
  else {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tPtr,0)
    ;
    iVar2 = isdigit((int)*pvVar3);
    if (iVar2 == 0) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tPtr,
                          0);
      if (*pvVar3 != '-') {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            tPtr,0);
        if (*pvVar3 != '+') goto LAB_00110f4d;
      }
    }
    __nptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tPtr);
    strtol(__nptr,&local_20,10);
    aValue_local._7_1_ = *local_20 == '\0';
  }
  return aValue_local._7_1_;
}

Assistant:

static bool is_integer(const std::string &aValue) {
    if (aValue.empty() ||
        ((!isdigit(aValue[0])) && (aValue[0] != '-') && (aValue[0] != '+')))
      return false;
    char *tPtr;
    strtol(aValue.c_str(), &tPtr, 10);
    return (*tPtr == 0);
  }